

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryFile.hpp
# Opt level: O2

void __thiscall supermap::io::TemporaryFile::~TemporaryFile(TemporaryFile *this)

{
  element_type *peVar1;
  path pStack_38;
  
  if (this->canceledDeletion_ == false) {
    peVar1 = (this->manager_).
             super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&pStack_38,&this->path_,auto_format);
    (*peVar1->_vptr_FileManager[2])(peVar1,&pStack_38);
    std::filesystem::__cxx11::path::~path(&pStack_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->manager_).
              super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TemporaryFile() {
        if (!canceledDeletion_) {
            manager_->remove(path_);
        }
    }